

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dump.cc
# Opt level: O1

ostream * pstack::operator<<(ostream *os,JSON<Elf64_Sym,_pstack::Elf::Section> *t)

{
  ostream *poVar1;
  JObject *pJVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  uint local_50;
  uint local_4c;
  undefined1 local_48 [24];
  _Alloc_hider local_30;
  char local_28 [8];
  
  Elf::Object::getLinkedSection(t->context->elf,t->context);
  local_30._M_p = "";
  local_48._16_8_ = os;
  std::__ostream_insert<char,std::char_traits<char>>(os,"{ ",2);
  Elf::Section::io((Section *)local_48);
  (*(*(_func_int ***)local_48._0_8_)[7])(&local_70,local_48._0_8_,(ulong)t->object->st_name);
  local_28[0] = '\0';
  pJVar2 = JObject::field<char[5],std::__cxx11::string,char>
                     ((JObject *)(local_48 + 0x10),(char (*) [5])0x167b71,&local_70,local_28);
  local_28[1] = 0;
  pJVar2 = JObject::field<char[6],unsigned_long,char>
                     (pJVar2,(char (*) [6])0x16855c,&t->object->st_value,local_28 + 1);
  local_28[2] = 0;
  pJVar2 = JObject::field<char[5],unsigned_long,char>
                     (pJVar2,(char (*) [5])0x1686f5,&t->object->st_size,local_28 + 2);
  local_50 = (uint)t->object->st_info;
  local_28[3] = 0;
  pJVar2 = JObject::field<char[5],int,char>
                     (pJVar2,(char (*) [5])0x168402,(int *)&local_50,local_28 + 3);
  local_28[4] = 0;
  pJVar2 = JObject::field<char[8],char_const*,char>
                     (pJVar2,(char (*) [8])"binding",
                      operator<<::bindingNames + (t->object->st_info >> 4),local_28 + 4);
  local_28[5] = 0;
  pJVar2 = JObject::field<char[5],char_const*,char>
                     (pJVar2,(char (*) [5])0x168c2c,
                      operator<<::typeNames + (t->object->st_info & 0xf),local_28 + 5);
  local_4c = (uint)t->object->st_other;
  local_28[6] = 0;
  pJVar2 = JObject::field<char[6],int,char>
                     (pJVar2,(char (*) [6])"other",(int *)&local_4c,local_28 + 6);
  local_28[7] = 0;
  pJVar2 = JObject::field<char[6],unsigned_short,char>
                     (pJVar2,(char (*) [6])"shndx",&t->object->st_shndx,local_28 + 7);
  poVar1 = pJVar2->os;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_48._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_48._8_8_);
  }
  JObject::~JObject((JObject *)(local_48 + 0x10));
  return poVar1;
}

Assistant:

std::ostream &
operator<< (std::ostream &os, const JSON<Elf::Sym, Elf::Section> &t)
{
    auto &sec = t.context;
    static const char *bindingNames[] = {
        "STB_LOCAL",
        "STB_GLOBAL",
        "STB_WEAK",
        "unknown3",
        "unknown4",
        "unknown5",
        "unknown6",
        "unknown7",
        "unknown8",
        "unknown9",
        "unknowna",
        "unknownb",
        "unknownc",
        "STB_LOPROC",
        "STB_LOPROC + 1",
        "STB_HIPROC + 1",
    };
    static const char *typeNames[] = {
        "STT_NOTYPE",
        "STT_OBJECT",
        "STT_FUNC",
        "STT_SECTION",
        "STT_FILE",
        "STT_5",
        "STT_6",
        "STT_7",
        "STT_8",
        "STT_9",
        "STT_A",
        "STT_B",
        "STT_C",
        "STT_LOPROC",
        "STT_LOPROC + 1",
        "STT_HIPROC"
    };
    auto &symStrings = sec.elf->getLinkedSection(sec);

    return JObject(os)
        .field("name", symStrings.io()->readString(t.object.st_name))
        .field("value", t.object.st_value)
        .field("size",t.object.st_size)
        .field("info", int(t.object.st_info))
        .field("binding", bindingNames[t.object.st_info >> 4])
        .field("type", typeNames[t.object.st_info & 0xf])
        .field("other", int(t.object.st_other))
        .field("shndx", t.object.st_shndx);
}